

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O1

el_action_t em_kill_region(EditLine *el,wint_t c)

{
  undefined4 *puVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  
  pwVar2 = (el->el_chared).c_kill.mark;
  if (pwVar2 != (wchar_t *)0x0) {
    pwVar3 = (el->el_line).cursor;
    pwVar5 = (el->el_chared).c_kill.buf;
    pwVar4 = pwVar2;
    if (pwVar3 < pwVar2) {
      uVar6 = 0;
      do {
        puVar1 = (undefined4 *)((long)pwVar3 + uVar6);
        *(undefined4 *)((long)pwVar5 + uVar6) = *puVar1;
        uVar6 = uVar6 + 4;
      } while (puVar1 + 1 < pwVar2);
      (el->el_chared).c_kill.last = (wchar_t *)((long)pwVar5 + uVar6);
      c_delafter(el,(wchar_t)(uVar6 >> 2));
    }
    else {
      for (; pwVar4 < pwVar3; pwVar4 = pwVar4 + 1) {
        *pwVar5 = *pwVar4;
        pwVar5 = pwVar5 + 1;
      }
      (el->el_chared).c_kill.last = pwVar5;
      c_delbefore(el,(wchar_t)((ulong)((long)pwVar4 - (long)pwVar2) >> 2));
      (el->el_line).cursor = (el->el_chared).c_kill.mark;
    }
    return '\x04';
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_kill_region(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	if (!el->el_chared.c_kill.mark)
		return CC_ERROR;

	if (el->el_chared.c_kill.mark > el->el_line.cursor) {
		cp = el->el_line.cursor;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_chared.c_kill.mark)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delafter(el, (int)(cp - el->el_line.cursor));
	} else {		/* mark is before cursor */
		cp = el->el_chared.c_kill.mark;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_line.cursor)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delbefore(el, (int)(cp - el->el_chared.c_kill.mark));
		el->el_line.cursor = el->el_chared.c_kill.mark;
	}
	return CC_REFRESH;
}